

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O2

bool __thiscall stk::FileWrite::setMatFile(FileWrite *this,string *fileName)

{
  int iVar1;
  long lVar2;
  FILE *pFVar3;
  ostream *poVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  int iVar8;
  float fVar9;
  undefined4 local_168;
  int local_164;
  string name;
  int local_140 [9];
  char local_11c [124];
  undefined4 local_a0;
  undefined8 local_9c;
  undefined8 uStack_94;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined8 local_6c;
  undefined8 local_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  uint local_3c;
  undefined4 local_38;
  int local_34;
  
  lVar2 = std::__cxx11::string::find((char *)fileName,0x11141c);
  if (lVar2 == -1) {
    std::__cxx11::string::append((char *)fileName);
  }
  pFVar3 = fopen((fileName->_M_dataplus)._M_p,"w+b");
  this->fd_ = (FILE *)pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileWrite: could not create MAT file: ");
    std::operator<<(poVar4,(string *)fileName);
    return false;
  }
  if (this->dataType_ != 0x20) {
    this->dataType_ = 0x20;
    poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileWrite: using 64-bit floating-point data format for file ");
    poVar4 = std::operator<<(poVar4,(string *)fileName);
    std::operator<<(poVar4,'.');
    Stk::handleError(&this->super_Stk,DEBUG_PRINT);
  }
  memcpy(local_11c,
         "MATLAB 5.0 MAT-file, Generated using the Synthesis ToolKit in C++ (STK). By Perry R. Cook and Gary P. Scavone."
         ,0x6f);
  for (uVar5 = strlen(local_11c); uVar5 < 0x7c; uVar5 = uVar5 + 1) {
    local_11c[uVar5] = ' ';
  }
  local_a0 = 0x4d490100;
  local_9c = 0x380000000e;
  uStack_94 = 0x800000006;
  local_8c = 6;
  uStack_84 = 0x800000005;
  local_7c = 0x100000001;
  uStack_74 = 0x736600020001;
  local_6c = 0x800000009;
  local_64 = Stk::srate_;
  local_5c = 0xe;
  uStack_54 = 0x800000006;
  local_4c = 6;
  uStack_44 = 0x800000005;
  local_3c = this->channels_;
  local_38 = 0;
  std::__cxx11::string::string((string *)&name,(string *)fileName);
  std::__cxx11::string::find_last_of((char *)&name,0x1114f8);
  std::__cxx11::string::substr((ulong)local_140,(ulong)&name);
  std::__cxx11::string::operator=((string *)&name,(string *)local_140);
  std::__cxx11::string::~string((string *)local_140);
  iVar1 = 0x23;
  if ((int)name._M_string_length < 0x23) {
    iVar1 = (int)name._M_string_length;
  }
  iVar8 = iVar1 + -4;
  local_34 = 1;
  if ((int)name._M_string_length < 9) {
    local_34 = iVar8 * 0x10000 + 1;
  }
  local_140[0] = iVar8;
  sVar6 = fwrite(local_11c,0xec,1,(FILE *)this->fd_);
  if (sVar6 == 1) {
    if ((int)name._M_string_length < 9) {
      sVar6 = fwrite(name._M_dataplus._M_p,(long)iVar8,1,(FILE *)this->fd_);
      if ((sVar6 == 1) && (iVar1 = fseek((FILE *)this->fd_,(ulong)(8 - iVar1),1), iVar1 != -1)) {
        iVar1 = 0x30;
LAB_0010ea59:
        local_168 = 9;
        sVar6 = fwrite(&local_168,4,1,(FILE *)this->fd_);
        if (sVar6 == 1) {
          local_168 = 0;
          sVar6 = fwrite(&local_168,4,1,(FILE *)this->fd_);
          if ((((sVar6 == 1) &&
               (local_164 = iVar1, iVar1 = fseek((FILE *)this->fd_,0xc4,0), iVar1 != -1)) &&
              (sVar6 = fwrite(&local_164,4,1,(FILE *)this->fd_), sVar6 == 1)) &&
             (iVar1 = fseek((FILE *)this->fd_,0,2), iVar1 != -1)) {
            this->byteswap_ = false;
            poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                                     "FileWrite: creating MAT-file: ");
            std::operator<<(poVar4,(string *)fileName);
            bVar7 = true;
            Stk::handleError(&this->super_Stk,STATUS);
            goto LAB_0010eb38;
          }
        }
      }
    }
    else {
      sVar6 = fwrite(local_140,4,1,(FILE *)this->fd_);
      iVar1 = local_140[0];
      if ((sVar6 == 1) &&
         (sVar6 = fwrite(name._M_dataplus._M_p,(long)local_140[0],1,(FILE *)this->fd_), sVar6 == 1))
      {
        fVar9 = ceilf((float)iVar1 * 0.125);
        iVar1 = fseek((FILE *)this->fd_,(long)((int)fVar9 * 8 - iVar1),1);
        if (iVar1 != -1) {
          iVar1 = (int)fVar9 * 8 + 0x30;
          goto LAB_0010ea59;
        }
      }
    }
  }
  poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                           "FileWrite: could not write MAT-file header for file ");
  poVar4 = std::operator<<(poVar4,(string *)fileName);
  std::operator<<(poVar4,'.');
  bVar7 = false;
LAB_0010eb38:
  std::__cxx11::string::~string((string *)&name);
  return bVar7;
}

Assistant:

bool FileWrite :: setMatFile( std::string fileName )
{
  if ( fileName.find( ".mat" ) == std::string::npos ) fileName += ".mat";
  fd_ = fopen( fileName.c_str(), "w+b" );
  if ( !fd_ ) {
    oStream_ << "FileWrite: could not create MAT file: " << fileName;
    return false;
  }

  if ( dataType_ != STK_FLOAT64 ) {
    dataType_ = STK_FLOAT64;
    oStream_ << "FileWrite: using 64-bit floating-point data format for file " << fileName << '.';
    handleError( StkError::DEBUG_PRINT );
  }

  struct MatHeader hdr;
  strcpy( hdr.heading,"MATLAB 5.0 MAT-file, Generated using the Synthesis ToolKit in C++ (STK). By Perry R. Cook and Gary P. Scavone." );
  for ( size_t i =strlen(hdr.heading); i<124; i++ ) hdr.heading[i] = ' ';

  // Header Flag Fields
  hdr.hff[0] = (SINT16) 0x0100;   // Version field
  hdr.hff[1] = (SINT16) 'M';      // Endian indicator field ("MI")
  hdr.hff[1] <<= 8;
  hdr.hff[1] += 'I';

  // Write sample rate in array data element
  hdr.fs[0] = (SINT32) 14;       // Matlab array data type value
  hdr.fs[1] = (SINT32) 56;        // Size of data element to follow (in bytes)

  // Numeric Array Subelements (4):
  // 1. Array Flags
  hdr.fs[2] = (SINT32) 6;     // Matlab 32-bit unsigned integer data type value
  hdr.fs[3] = (SINT32) 8;     // 8 bytes of data to follow
  hdr.fs[4] = (SINT32) 6;     // Double-precision array, no array flags set
  hdr.fs[5] = (SINT32) 0;     // 4 bytes undefined
  // 2. Array Dimensions
  hdr.fs[6] = (SINT32) 5;     // Matlab 32-bit signed integer data type value
  hdr.fs[7] = (SINT32) 8;     // 8 bytes of data to follow (2D array)
  hdr.fs[8] = (SINT32) 1;     // 1 row
  hdr.fs[9] = (SINT32) 1;     // 1 column
  // 3. Array Name (small data format element)
  hdr.fs[10] = 0x00020001;
  hdr.fs[11] = 's' << 8;
  hdr.fs[11] += 'f';
  // 4. Real Part
  hdr.fs[12] = 9;             // Matlab IEEE 754 double data type
  hdr.fs[13] = 8;             // 8 bytes of data to follow
  FLOAT64 *sampleRate = (FLOAT64 *)&hdr.fs[14];
  *sampleRate = (FLOAT64) Stk::sampleRate();

  // Write audio samples in array data element
  hdr.adf[0] = (SINT32) 14;       // Matlab array data type value
  hdr.adf[1] = (SINT32) 0;        // Size of file after this point to end (in bytes)

  // Numeric Array Subelements (4):
  // 1. Array Flags
  hdr.adf[2] = (SINT32) 6;        // Matlab 32-bit unsigned integer data type value
  hdr.adf[3] = (SINT32) 8;        // 8 bytes of data to follow
  hdr.adf[4] = (SINT32) 6;        // Double-precision array, no array flags set
  hdr.adf[5] = (SINT32) 0;        // 4 bytes undefined
  // 2. Array Dimensions
  hdr.adf[6] = (SINT32) 5;        // Matlab 32-bit signed integer data type value
  hdr.adf[7] = (SINT32) 8;        // 8 bytes of data to follow (2D array)
  hdr.adf[8] = (SINT32) channels_; // This is the number of rows
  hdr.adf[9] = (SINT32) 0;        // This is the number of columns

  // 3. Array Name We'll use fileName for the matlab array name (as
  // well as the file name), though we might need to strip off a
  // leading directory path.  If fileName is 4 characters or less, we
  // have to use a small data format element for the array name data
  // element.  Otherwise, the array name must be formatted in 8-byte
  // increments (up to 31 characters + NULL).
  std::string name = fileName;
  size_t found;
  found = name.find_last_of("/\\");
  name = name.substr(found+1);
  SINT32 namelength = (SINT32) name.size() - 4; // strip off the ".mat" extension
  if ( namelength > 31 ) namelength = 31; // Truncate name to 31 characters.
  if ( namelength > 4 ) {
    hdr.adf[10] = (SINT32) 1;        // Matlab 8-bit signed integer data type value
  }
  else { // Compressed data element format
    hdr.adf[10] = (namelength << 16) + 1;
  }

  SINT32 headsize = 40;        // Number of bytes in audio data element so far.

  // Write the fixed portion of the header
  if ( fwrite(&hdr, 236, 1, fd_) != 1 ) goto error;

  // Write MATLAB array name
  SINT32 tmp;
  if ( namelength > 4 ) {
    if ( fwrite(&namelength, 4, 1, fd_) != 1) goto error;
    if ( fwrite(name.c_str(), namelength, 1, fd_) != 1 ) goto error;
    tmp = (SINT32) ceil((float)namelength / 8);
    if ( fseek(fd_, tmp*8-namelength, SEEK_CUR) == -1 ) goto error;
    headsize += tmp * 8;
  }
  else { // Compressed data element format
    if ( fwrite(name.c_str(), namelength, 1, fd_) != 1 ) goto error;
    tmp = 4 - namelength;
    if ( fseek(fd_, tmp, SEEK_CUR) == -1 ) goto error;
  }

  // Finish writing known header information
  //4. Real Part
  tmp = 9;        // Matlab IEEE 754 double data type
  if ( fwrite(&tmp, 4, 1, fd_) != 1 ) goto error;
  tmp = 0;        // Size of real part subelement in bytes (8 per sample)
  if ( fwrite(&tmp, 4, 1, fd_) != 1 ) goto error;
  headsize += 8;  // Total number of bytes in data element so far

  if ( fseek(fd_, 196, SEEK_SET) == -1 ) goto error;
  if ( fwrite(&headsize, 4, 1, fd_) != 1 ) goto error; // Write header size ... will update at end
  if ( fseek(fd_, 0, SEEK_END) == -1 ) goto error;

  byteswap_ = false;
  oStream_ << "FileWrite: creating MAT-file: " << fileName;
  handleError( StkError::STATUS );

  return true;

 error:
  oStream_ << "FileWrite: could not write MAT-file header for file " << fileName << '.';
  return false;
}